

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slater_exchange.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinSlaterExchange>::eval_exc_polar_impl
               (double rho_a,double rho_b,double *eps)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined8 uStack_70;
  undefined8 uStack_50;
  undefined8 uStack_30;
  undefined8 uStack_20;
  
  dVar14 = 1.0 / (rho_a + rho_b);
  dVar6 = cbrt(1e-15);
  dVar7 = rho_a * 1.2599210498948732;
  auVar1._8_4_ = SUB84(rho_b * 1.2599210498948732,0);
  auVar1._0_8_ = dVar7;
  auVar1._12_4_ = (int)((ulong)(rho_b * 1.2599210498948732) >> 0x20);
  dVar8 = cbrt(rho_a + rho_b);
  auVar2._8_4_ = SUB84(dVar14,0);
  auVar2._0_8_ = dVar14;
  auVar2._12_4_ = (int)((ulong)dVar14 >> 0x20);
  dVar9 = dVar14 * rho_a;
  auVar3._8_4_ = SUB84(dVar14 * rho_b,0);
  auVar3._0_8_ = dVar9;
  auVar3._12_4_ = (int)((ulong)(dVar14 * rho_b) >> 0x20);
  dVar10 = cbrt(dVar9);
  uStack_50 = auVar3._8_8_;
  uVar12 = -(ulong)(dVar9 + dVar9 <= 1e-15);
  lVar13 = -(ulong)(uStack_50 + uStack_50 <= 1e-15);
  auVar4._8_4_ = (int)lVar13;
  auVar4._0_8_ = uVar12;
  auVar4._12_4_ = (int)((ulong)lVar13 >> 0x20);
  dVar9 = cbrt(uStack_50);
  uStack_20 = auVar1._8_8_;
  uStack_70 = auVar2._8_8_;
  uStack_30 = auVar4._8_8_;
  uVar11 = (ulong)(dVar6 * 1e-15) & uStack_30;
  auVar15._0_8_ = ~uVar12 & (ulong)(dVar10 * (dVar7 + dVar7) * dVar14);
  auVar15._8_8_ = ~uStack_30 & (ulong)(dVar9 * (uStack_20 + uStack_20) * uStack_70);
  auVar5._8_4_ = (int)uVar11;
  auVar5._0_8_ = (ulong)(dVar6 * 1e-15) & uVar12;
  auVar5._12_4_ = (int)(uVar11 >> 0x20);
  *eps = (double)(-(ulong)(1e-24 < rho_b) &
                 (ulong)(dVar8 * SUB168(auVar15 | auVar5,8) * -0.36927938319101117)) +
         (double)(-(ulong)(1e-24 < rho_a) &
                 (ulong)(dVar8 * SUB168(auVar15 | auVar5,0) * -0.36927938319101117));
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double& eps ) {

    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_pi;
    constexpr double t13 = constants::m_cbrt_2;
    constexpr double t5 = t2 / t3;


    const double t1 = rho_a <= dens_tol;
    const double t6 = rho_a + rho_b;
    const double t7 = 0.1e1 / t6;
    const double t8 = rho_a * t7;
    const double t10 = 0.2e1 * t8 <= zeta_tol;
    const double t11 = safe_math::cbrt( zeta_tol );
    const double t12 = t11 * zeta_tol;
    const double t14 = t13 * rho_a;
    const double t15 = safe_math::cbrt( t8 );
    const double t19 = piecewise_functor_3( t10, t12, 0.2e1 * t14 * t7 * t15 );
    const double t20 = safe_math::cbrt( t6 );
    const double t24 = piecewise_functor_3( t1, 0.0, -0.3e1 / 0.8e1 * t5 * t19 * t20 );
    const double t25 = alpha * t24;
    const double t26 = rho_b <= dens_tol;
    const double t27 = rho_b * t7;
    const double t29 = 0.2e1 * t27 <= zeta_tol;
    const double t30 = t13 * rho_b;
    const double t31 = safe_math::cbrt( t27 );
    const double t35 = piecewise_functor_3( t29, t12, 0.2e1 * t30 * t7 * t31 );
    const double t39 = piecewise_functor_3( t26, 0.0, -0.3e1 / 0.8e1 * t5 * t35 * t20 );
    const double t40 = alpha * t39;


    eps = t25 + t40;

  }